

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quasiquote_conversion.cpp
# Opt level: O3

bool __thiscall
skiwi::anon_unknown_26::quasiquote_conversion_visitor::has_splicing
          (quasiquote_conversion_visitor *this,cell *in)

{
  pointer pcVar1;
  pointer pcVar2;
  bool bVar3;
  cell *__p;
  cell *v;
  value_type *__x;
  vector<skiwi::cell,_std::allocator<skiwi::cell>_> *__range5;
  bool bVar4;
  vector<skiwi::cell,_std::allocator<skiwi::cell>_> todo;
  cell c;
  vector<skiwi::cell,_std::allocator<skiwi::cell>_> local_a8;
  quasiquote_conversion_visitor local_88;
  long *local_80 [2];
  long local_70 [2];
  vector<skiwi::cell,_std::allocator<skiwi::cell>_> local_60;
  vector<skiwi::cell,_std::allocator<skiwi::cell>_> local_48;
  
  local_a8.super__Vector_base<skiwi::cell,_std::allocator<skiwi::cell>_>._M_impl.
  super__Vector_impl_data._M_start = (cell *)0x0;
  local_a8.super__Vector_base<skiwi::cell,_std::allocator<skiwi::cell>_>._M_impl.
  super__Vector_impl_data._M_finish = (cell *)0x0;
  local_a8.super__Vector_base<skiwi::cell,_std::allocator<skiwi::cell>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::vector<skiwi::cell,_std::allocator<skiwi::cell>_>::push_back(&local_a8,(value_type *)this);
  bVar4 = local_a8.super__Vector_base<skiwi::cell,_std::allocator<skiwi::cell>_>._M_impl.
          super__Vector_impl_data._M_start !=
          local_a8.super__Vector_base<skiwi::cell,_std::allocator<skiwi::cell>_>._M_impl.
          super__Vector_impl_data._M_finish;
  if (bVar4) {
    do {
      pcVar2 = local_a8.super__Vector_base<skiwi::cell,_std::allocator<skiwi::cell>_>._M_impl.
               super__Vector_impl_data._M_finish;
      local_88.super_base_visitor<skiwi::(anonymous_namespace)::quasiquote_conversion_visitor>.
      _vptr_base_visitor._0_4_ =
           local_a8.super__Vector_base<skiwi::cell,_std::allocator<skiwi::cell>_>._M_impl.
           super__Vector_impl_data._M_finish[-1].type;
      pcVar1 = local_a8.super__Vector_base<skiwi::cell,_std::allocator<skiwi::cell>_>._M_impl.
               super__Vector_impl_data._M_finish[-1].value._M_dataplus._M_p;
      local_80[0] = local_70;
      std::__cxx11::string::_M_construct<char*>
                ((string *)local_80,pcVar1,
                 pcVar1 + local_a8.super__Vector_base<skiwi::cell,_std::allocator<skiwi::cell>_>.
                          _M_impl.super__Vector_impl_data._M_finish[-1].value._M_string_length);
      std::vector<skiwi::cell,_std::allocator<skiwi::cell>_>::vector(&local_60,&pcVar2[-1].pair);
      std::vector<skiwi::cell,_std::allocator<skiwi::cell>_>::vector(&local_48,&pcVar2[-1].vec);
      __p = local_a8.super__Vector_base<skiwi::cell,_std::allocator<skiwi::cell>_>._M_impl.
            super__Vector_impl_data._M_finish + -1;
      local_a8.super__Vector_base<skiwi::cell,_std::allocator<skiwi::cell>_>._M_impl.
      super__Vector_impl_data._M_finish = __p;
      __gnu_cxx::new_allocator<skiwi::cell>::destroy<skiwi::cell>
                ((new_allocator<skiwi::cell> *)&local_a8,__p);
      bVar3 = tag_is_comma_atsign(&local_88,__p);
      pcVar2 = local_48.super__Vector_base<skiwi::cell,_std::allocator<skiwi::cell>_>._M_impl.
               super__Vector_impl_data._M_finish;
      if (bVar3) {
        std::vector<skiwi::cell,_std::allocator<skiwi::cell>_>::~vector(&local_48);
        std::vector<skiwi::cell,_std::allocator<skiwi::cell>_>::~vector(&local_60);
        if (local_80[0] != local_70) {
          operator_delete(local_80[0],local_70[0] + 1);
        }
        break;
      }
      if (((cell_type)
           local_88.super_base_visitor<skiwi::(anonymous_namespace)::quasiquote_conversion_visitor>.
           _vptr_base_visitor == ct_pair) &&
         ((long)local_60.super__Vector_base<skiwi::cell,_std::allocator<skiwi::cell>_>._M_impl.
                super__Vector_impl_data._M_finish -
          (long)local_60.super__Vector_base<skiwi::cell,_std::allocator<skiwi::cell>_>._M_impl.
                super__Vector_impl_data._M_start == 0xb0)) {
        std::vector<skiwi::cell,_std::allocator<skiwi::cell>_>::push_back
                  (&local_a8,
                   local_60.super__Vector_base<skiwi::cell,_std::allocator<skiwi::cell>_>._M_impl.
                   super__Vector_impl_data._M_start);
        std::vector<skiwi::cell,_std::allocator<skiwi::cell>_>::push_back
                  (&local_a8,
                   local_60.super__Vector_base<skiwi::cell,_std::allocator<skiwi::cell>_>._M_impl.
                   super__Vector_impl_data._M_start + 1);
      }
      else {
        __x = local_48.super__Vector_base<skiwi::cell,_std::allocator<skiwi::cell>_>._M_impl.
              super__Vector_impl_data._M_start;
        if ((cell_type)
            local_88.super_base_visitor<skiwi::(anonymous_namespace)::quasiquote_conversion_visitor>
            ._vptr_base_visitor == ct_vector) {
          for (; __x != pcVar2; __x = __x + 1) {
            std::vector<skiwi::cell,_std::allocator<skiwi::cell>_>::push_back(&local_a8,__x);
          }
        }
      }
      std::vector<skiwi::cell,_std::allocator<skiwi::cell>_>::~vector(&local_48);
      std::vector<skiwi::cell,_std::allocator<skiwi::cell>_>::~vector(&local_60);
      if (local_80[0] != local_70) {
        operator_delete(local_80[0],local_70[0] + 1);
      }
      bVar4 = local_a8.super__Vector_base<skiwi::cell,_std::allocator<skiwi::cell>_>._M_impl.
              super__Vector_impl_data._M_start !=
              local_a8.super__Vector_base<skiwi::cell,_std::allocator<skiwi::cell>_>._M_impl.
              super__Vector_impl_data._M_finish;
    } while (bVar4);
  }
  std::vector<skiwi::cell,_std::allocator<skiwi::cell>_>::~vector(&local_a8);
  return bVar4;
}

Assistant:

bool has_splicing(const cell& in)
      {
      std::vector<cell> todo;
      todo.push_back(in);
      while (!todo.empty())
        {
        cell c = todo.back();
        todo.pop_back();
        if (tag_is_comma_atsign(c))
          return true;
        if (is_pair(c))
          {
          todo.push_back(c.pair[0]);
          todo.push_back(c.pair[1]);
          }
        else if (c.type == ct_vector)
          {
          for (const auto& v : c.vec)
            todo.push_back(v);
          }
        }
      return false;
      }